

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::BeginInitExpr(TypeChecker *this,Type type)

{
  initializer_list<wabt::Type> __l;
  allocator<wabt::Type> local_69;
  Type local_68;
  iterator local_60;
  size_type local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  TypeChecker *local_20;
  TypeChecker *this_local;
  Type type_local;
  
  local_20 = this;
  unique0x10000173 = type;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(&this->type_stack_);
  std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::clear
            (&this->label_stack_);
  memset(&local_38,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_38);
  local_68 = stack0xffffffffffffffec;
  local_60 = &local_68;
  local_58 = 1;
  std::allocator<wabt::Type>::allocator(&local_69);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,__l,&local_69);
  PushLabel(this,InitExpr,&local_38,&local_50);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_50);
  std::allocator<wabt::Type>::~allocator(&local_69);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_38);
  Result::Result((Result *)&type_local,Ok);
  return (Result)type_local.enum_;
}

Assistant:

Result TypeChecker::BeginInitExpr(Type type) {
  type_stack_.clear();
  label_stack_.clear();
  PushLabel(LabelType::InitExpr, TypeVector(), {type});
  return Result::Ok;
}